

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateStaticInitializer
          (FileGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  Sub *local_290;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  undefined1 local_249;
  anon_class_16_2_af3419d6_for_cb local_248;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_1f9;
  string local_1f8;
  Sub *local_1d8;
  Sub local_1d0;
  Sub local_118;
  iterator local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  undefined1 local_40 [8];
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *inits;
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *__end3;
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *__begin3;
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  (*__range3) [2];
  Printer *pPStack_18;
  int priority;
  Printer *p_local;
  FileGenerator *this_local;
  
  __range3._4_4_ = 0;
  inits = (vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
           *)&this->file_;
  __end3 = this->static_initializers_;
  __begin3 = __end3;
  pPStack_18 = p;
  p_local = (Printer *)this;
  for (; __end3 != inits; __end3 = __end3 + 1) {
    local_40 = (undefined1  [8])__end3;
    __range3._4_4_ = __range3._4_4_ + 1;
    bVar2 = std::
            vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
            ::empty(__end3);
    pPVar1 = pPStack_18;
    if (!bVar2) {
      local_249 = 1;
      local_1d8 = &local_1d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"priority",&local_1f9)
      ;
      io::Printer::Sub::Sub<int&>(&local_1d0,&local_1f8,(int *)((long)&__range3 + 4));
      local_1d8 = &local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"expr",&local_231);
      local_248.inits =
           (vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
            *)local_40;
      local_248.p = &stack0xffffffffffffffe8;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateStaticInitializer(google::protobuf::io::Printer*)::__0>
                (&local_118,&local_230,&local_248);
      local_249 = 0;
      local_60 = &local_1d0;
      local_58 = 2;
      v._M_len = 2;
      v._M_array = local_60;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_50._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_260,
                 "\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type\n              _static_init$priority$_ PROTOBUF_UNUSED =\n                  ($expr$, ::std::false_type{});\n        "
                );
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (pPVar1,local_50._M_allocated_capacity,local_50._8_8_,local_260._M_len,
                 local_260._M_str);
      local_290 = (Sub *)&local_60;
      do {
        local_290 = local_290 + -1;
        io::Printer::Sub::~Sub(local_290);
      } while (local_290 != &local_1d0);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      std::
      vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
      ::clear((vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
               *)local_40);
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateStaticInitializer(io::Printer* p) {
  int priority = 0;
  for (auto& inits : static_initializers_) {
    ++priority;
    if (inits.empty()) continue;
    p->Emit(
        {{"priority", priority},
         {"expr",
          [&] {
            for (auto& init : inits) {
              init(p);
            }
          }}},
        R"cc(
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type
              _static_init$priority$_ PROTOBUF_UNUSED =
                  ($expr$, ::std::false_type{});
        )cc");
    // Reset the vector because we might be generating many files.
    inits.clear();
  }
}